

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  char *pcVar10;
  wasm_extern_vec_t exports;
  wasm_byte_vec_t binary;
  wasm_val_t res [4];
  wasm_extern_t *externs [1];
  wasm_val_vec_t results;
  wasm_val_vec_t args;
  wasm_extern_vec_t imports;
  wasm_valtype_vec_t tuple2;
  wasm_valtype_vec_t tuple1;
  wasm_valtype_t *types [4];
  wasm_val_t vals [4];
  long local_158;
  undefined8 *local_150;
  undefined1 local_148 [8];
  void *local_140;
  undefined8 local_138;
  ulong uStack_130;
  undefined8 local_128;
  long lStack_120;
  undefined8 local_118;
  long lStack_110;
  undefined8 local_108;
  ulong uStack_100;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  puts("Initializing...");
  uVar1 = wasm_engine_new();
  uVar2 = wasm_store_new(uVar1);
  puts("Loading binary...");
  __stream = fopen("multi.wasm","rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar3 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_148,sVar3);
    sVar3 = fread(local_140,sVar3,1,__stream);
    if (sVar3 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      lVar4 = wasm_module_new(uVar2,local_148);
      if (lVar4 == 0) {
        pcVar10 = "> Error compiling module!";
      }
      else {
        wasm_byte_vec_delete(local_148);
        puts("Creating callback...");
        local_98 = wasm_valtype_new(0);
        iVar9 = 1;
        local_90 = wasm_valtype_new(1);
        local_88 = wasm_valtype_new(1);
        local_80 = wasm_valtype_new(0);
        wasm_valtype_vec_new(local_a8,4,&local_98);
        wasm_valtype_vec_copy(local_b8,local_a8);
        uVar5 = wasm_functype_new(local_a8,local_b8);
        uVar6 = wasm_func_new(uVar2,uVar5,callback);
        wasm_functype_delete(uVar5);
        puts("Instantiating module...");
        local_f0 = wasm_func_as_extern(uVar6);
        local_c0 = &local_f0;
        local_c8 = 1;
        lVar7 = wasm_instance_new(uVar2,lVar4,&local_c8,0);
        if (lVar7 == 0) {
          pcVar10 = "> Error instantiating module!";
LAB_00101701:
          puts(pcVar10);
          return iVar9;
        }
        wasm_func_delete(uVar6);
        puts("Extracting export...");
        wasm_instance_exports(lVar7,&local_158);
        if (local_158 == 0) {
          pcVar10 = "> Error accessing exports!";
        }
        else {
          lVar8 = wasm_extern_as_func(*local_150);
          if (lVar8 != 0) {
            wasm_module_delete(lVar4);
            wasm_instance_delete(lVar7);
            puts("Calling export...");
            local_d0 = &local_78;
            local_78 = 0;
            local_48 = 0;
            uStack_70 = 1;
            local_68 = 1;
            uStack_60 = 2;
            local_58 = 1;
            uStack_50 = 3;
            uStack_40 = 4;
            local_e0 = &local_138;
            uStack_130 = 0;
            lStack_120 = 0;
            lStack_110 = 0;
            uStack_100 = 0;
            local_138 = 0x80;
            local_128 = 0x80;
            local_118 = 0x80;
            local_108 = 0x80;
            local_d8 = 4;
            local_e8 = 4;
            lVar4 = wasm_func_call(lVar8);
            if (lVar4 == 0) {
              wasm_extern_vec_delete(&local_158);
              puts("Printing result...");
              printf("> %u %lu %lu %u\n",uStack_130 & 0xffffffff,lStack_120,lStack_110,
                     uStack_100 & 0xffffffff);
              if ((int)uStack_130 != 4) {
                __assert_fail("res[0].of.i32 == 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/multi.c"
                              ,0x8f,"int main(int, const char **)");
              }
              if (lStack_120 != 3) {
                __assert_fail("res[1].of.i64 == 3",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/multi.c"
                              ,0x90,"int main(int, const char **)");
              }
              if (lStack_110 != 2) {
                __assert_fail("res[2].of.i64 == 2",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/multi.c"
                              ,0x91,"int main(int, const char **)");
              }
              if ((int)uStack_100 != 1) {
                __assert_fail("res[3].of.i32 == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/third_party/wasm-c-api/example/multi.c"
                              ,0x92,"int main(int, const char **)");
              }
              puts("Shutting down...");
              wasm_store_delete(uVar2);
              wasm_engine_delete(uVar1);
              iVar9 = 0;
              pcVar10 = "Done.";
            }
            else {
              iVar9 = 1;
              pcVar10 = "> Error calling function!";
            }
            goto LAB_00101701;
          }
          pcVar10 = "> Error accessing export!";
        }
      }
      goto LAB_001016d3;
    }
  }
  pcVar10 = "> Error loading module!";
LAB_001016d3:
  puts(pcVar10);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("multi.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external print functions.
  printf("Creating callback...\n");
  wasm_valtype_t* types[4] = {
    wasm_valtype_new_i32(), wasm_valtype_new_i64(),
    wasm_valtype_new_i64(), wasm_valtype_new_i32()
  };
  own wasm_valtype_vec_t tuple1, tuple2;
  wasm_valtype_vec_new(&tuple1, 4, types);
  wasm_valtype_vec_copy(&tuple2, &tuple1);
  own wasm_functype_t* callback_type = wasm_functype_new(&tuple1, &tuple2);
  own wasm_func_t* callback_func =
    wasm_func_new(store, callback_type, callback);

  wasm_functype_delete(callback_type);

  // Instantiate.
  printf("Instantiating module...\n");
  wasm_extern_t* externs[] = { wasm_func_as_extern(callback_func) };
  wasm_extern_vec_t imports = WASM_ARRAY_VEC(externs);
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, &imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_func_delete(callback_func);

  // Extract export.
  printf("Extracting export...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  if (exports.size == 0) {
    printf("> Error accessing exports!\n");
    return 1;
  }
  const wasm_func_t* run_func = wasm_extern_as_func(exports.data[0]);
  if (run_func == NULL) {
    printf("> Error accessing export!\n");
    return 1;
  }

  wasm_module_delete(module);
  wasm_instance_delete(instance);

  // Call.
  printf("Calling export...\n");
  wasm_val_t vals[4] = {
    WASM_I32_VAL(1), WASM_I64_VAL(2), WASM_I64_VAL(3), WASM_I32_VAL(4)
  };
  wasm_val_t res[4] = {
    WASM_INIT_VAL, WASM_INIT_VAL, WASM_INIT_VAL, WASM_INIT_VAL
  };
  wasm_val_vec_t args = WASM_ARRAY_VEC(vals);
  wasm_val_vec_t results = WASM_ARRAY_VEC(res);
  if (wasm_func_call(run_func, &args, &results)) {
    printf("> Error calling function!\n");
    return 1;
  }

  wasm_extern_vec_delete(&exports);

  // Print result.
  printf("Printing result...\n");
  printf("> %"PRIu32" %"PRIu64" %"PRIu64" %"PRIu32"\n",
    res[0].of.i32, res[1].of.i64, res[2].of.i64, res[3].of.i32);

  assert(res[0].of.i32 == 4);
  assert(res[1].of.i64 == 3);
  assert(res[2].of.i64 == 2);
  assert(res[3].of.i32 == 1);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}